

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  bool bVar8;
  bool bVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  aVar16.m128[2] = INFINITY;
  aVar16._0_8_ = 0x7f8000007f800000;
  aVar16.m128[3] = INFINITY;
  auVar17 = ZEXT1664((undefined1  [16])aVar16);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar16;
  aVar18.m128[2] = -INFINITY;
  aVar18._0_8_ = 0xff800000ff800000;
  aVar18.m128[3] = -INFINITY;
  auVar19 = ZEXT1664((undefined1  [16])aVar18);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar18;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar12 = r->_begin;
  sVar10 = __return_storage_ptr__->end;
  aVar22 = aVar16;
  aVar20 = aVar18;
  if (uVar12 < r->_end) {
    auVar24._8_4_ = 0xddccb9a2;
    auVar24._0_8_ = 0xddccb9a2ddccb9a2;
    auVar24._12_4_ = 0xddccb9a2;
    auVar25._8_4_ = 0x5dccb9a2;
    auVar25._0_8_ = 0x5dccb9a25dccb9a2;
    auVar25._12_4_ = 0x5dccb9a2;
    auVar23 = ZEXT1664((undefined1  [16])aVar16);
    auVar21 = ZEXT1664((undefined1  [16])aVar18);
    do {
      pBVar3 = (this->super_LineSegments).vertices.items;
      uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar12);
      uVar13 = (ulong)(uVar2 + 1);
      if (uVar13 < (pBVar3->super_RawBufferView).num) {
        lVar15 = 0;
        bVar9 = false;
        do {
          bVar8 = bVar9;
          if (bVar8) break;
          pcVar4 = pBVar3[lVar15].super_RawBufferView.ptr_ofs;
          sVar11 = pBVar3[lVar15].super_RawBufferView.stride;
          auVar1 = *(undefined1 (*) [16])(pcVar4 + sVar11 * uVar2);
          auVar27 = vcmpps_avx(auVar1,auVar24,2);
          auVar26 = vcmpps_avx(auVar1,auVar25,5);
          auVar27 = vorps_avx(auVar27,auVar26);
          if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar27[0xf] < '\0') break;
          auVar27 = *(undefined1 (*) [16])(pcVar4 + sVar11 * uVar13);
          auVar26 = vcmpps_avx(auVar27,auVar24,2);
          auVar28 = vcmpps_avx(auVar27,auVar25,5);
          auVar26 = vorps_avx(auVar26,auVar28);
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar26[0xf] < '\0') break;
          auVar1 = vshufps_avx(auVar1,auVar1,0xff);
          auVar27 = vshufps_avx(auVar27,auVar27,0xff);
          auVar1 = vminss_avx(auVar1,auVar27);
          lVar15 = 1;
          bVar9 = true;
        } while (0.0 <= auVar1._0_4_);
      }
      else {
        bVar8 = false;
      }
      sVar11 = k;
      if (bVar8) {
        pcVar4 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
        sVar11 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
        lVar15 = uVar2 * sVar11;
        lVar14 = uVar13 * sVar11;
        auVar27 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar15),
                             *(undefined1 (*) [16])(pcVar4 + lVar14));
        auVar1 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),
                            ZEXT416(*(uint *)(pcVar4 + lVar15 + 0xc)));
        fVar7 = auVar1._0_4_ * (this->super_LineSegments).maxRadiusScale;
        auVar1 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar15),
                            *(undefined1 (*) [16])(pcVar4 + lVar14));
        auVar28._4_4_ = fVar7;
        auVar28._0_4_ = fVar7;
        auVar28._8_4_ = fVar7;
        auVar28._12_4_ = fVar7;
        auVar27 = vsubps_avx(auVar27,auVar28);
        auVar26._0_4_ = auVar1._0_4_ + fVar7;
        auVar26._4_4_ = auVar1._4_4_ + fVar7;
        auVar26._8_4_ = auVar1._8_4_ + fVar7;
        auVar26._12_4_ = auVar1._12_4_ + fVar7;
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
        aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar26,ZEXT416((uint)uVar12),0x30);
        auVar1 = vminps_avx(auVar17._0_16_,(undefined1  [16])aVar5);
        auVar17 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar19._0_16_,(undefined1  [16])aVar6);
        auVar19 = ZEXT1664(auVar1);
        auVar27._0_4_ = aVar6.x + aVar5.x;
        auVar27._4_4_ = aVar6.y + aVar5.y;
        auVar27._8_4_ = aVar6.z + aVar5.z;
        auVar27._12_4_ = aVar6.field_3.w + aVar5.field_3.w;
        auVar1 = vminps_avx(auVar23._0_16_,auVar27);
        auVar23 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar21._0_16_,auVar27);
        auVar21 = ZEXT1664(auVar1);
        sVar10 = sVar10 + 1;
        sVar11 = k + 1;
        prims[k].lower.field_0.field_1 = aVar5;
        prims[k].upper.field_0.field_1 = aVar6;
      }
      aVar20 = auVar21._0_16_;
      aVar22 = auVar23._0_16_;
      aVar18 = auVar19._0_16_;
      aVar16 = auVar17._0_16_;
      uVar12 = uVar12 + 1;
      k = sVar11;
    } while (uVar12 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->end = sVar10;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }